

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

XSIDCDefinition * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,IdentityConstraint *ic,XSModel *xsModel)

{
  XMLSize_t maxElems;
  int iVar1;
  XSIDCDefinition *this_00;
  BaseRefVectorOf<char16_t> *this_01;
  IC_Field *pIVar2;
  XMLCh *toAdd;
  XSIDCDefinition *keyIC;
  XSAnnotation *headAnnot;
  XMLSize_t i;
  XMLSize_t index;
  XSObjectFactory *this_02;
  
  this_00 = (XSIDCDefinition *)XSModel::getXSObject(xsModel,ic);
  if (this_00 == (XSIDCDefinition *)0x0) {
    if ((ic->fFields == (RefVectorOf<xercesc_4_0::IC_Field> *)0x0) ||
       (maxElems = (ic->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount,
       maxElems == 0)) {
      this_01 = (BaseRefVectorOf<char16_t> *)0x0;
    }
    else {
      this_01 = (BaseRefVectorOf<char16_t> *)XMemory::operator_new(0x30,this->fMemoryManager);
      RefArrayVectorOf<char16_t>::RefArrayVectorOf
                ((RefArrayVectorOf<char16_t> *)this_01,maxElems,true,this->fMemoryManager);
      for (index = 0; maxElems != index; index = index + 1) {
        pIVar2 = IdentityConstraint::getFieldAt(ic,index);
        toAdd = XMLString::replicate(pIVar2->fXPath->fExpression,this->fMemoryManager);
        BaseRefVectorOf<char16_t>::addElement(this_01,toAdd);
      }
    }
    iVar1 = (*(ic->super_XSerializable)._vptr_XSerializable[5])(ic);
    if ((short)iVar1 == 2) {
      keyIC = addOrFind(this,(IdentityConstraint *)ic[1].super_XSerializable._vptr_XSerializable,
                        xsModel);
    }
    else {
      keyIC = (XSIDCDefinition *)0x0;
    }
    this_02 = (XSObjectFactory *)0x48;
    this_00 = (XSIDCDefinition *)XMemory::operator_new(0x48,this->fMemoryManager);
    headAnnot = getAnnotationFromModel(this_02,xsModel,ic);
    XSIDCDefinition::XSIDCDefinition
              (this_00,ic,keyIC,headAnnot,(StringList *)this_01,xsModel,this->fMemoryManager);
    putObjectInMap(this,ic,(XSObject *)this_00);
  }
  return this_00;
}

Assistant:

XSIDCDefinition* XSObjectFactory::addOrFind(IdentityConstraint* const ic,
                                            XSModel* const xsModel)
{
    XSIDCDefinition* xsObj = (XSIDCDefinition*) xsModel->getXSObject(ic);
    if (!xsObj)
    {
        XSIDCDefinition* keyIC = 0;
        StringList*      stringList = 0;
        XMLSize_t        fieldCount = ic->getFieldCount();

        if (fieldCount)
        {
            stringList = new (fMemoryManager) RefArrayVectorOf<XMLCh>(
                fieldCount, true, fMemoryManager);

            for(XMLSize_t i=0; i<fieldCount; i++)
            {
                XMLCh* expr = XMLString::replicate
                (
                    ic->getFieldAt(i)->getXPath()->getExpression()
                    , fMemoryManager
                );
                stringList->addElement(expr);
            }
        }

        if (ic->getType() == IdentityConstraint::ICType_KEYREF)
            keyIC = addOrFind(((IC_KeyRef*) ic)->getKey(), xsModel);

        xsObj= new (fMemoryManager) XSIDCDefinition
        (
            ic
            , keyIC
            , getAnnotationFromModel(xsModel, ic)
            , stringList
            , xsModel
            , fMemoryManager
        );
        putObjectInMap(ic, xsObj);
    }

    return xsObj;
}